

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void check_labels(c2m_ctx_t c2m_ctx,node_t_conflict labels,node_t_conflict target)

{
  ulong uVar1;
  uint uVar2;
  check_ctx *pcVar3;
  type *ptVar4;
  ulong *puVar5;
  undefined8 *puVar6;
  byte *pbVar7;
  int *piVar8;
  symbol_t el_00;
  int iVar9;
  uint uVar10;
  node_t pnVar11;
  void *pvVar12;
  mir_size_t mVar13;
  long lVar14;
  char *pcVar15;
  node_t_conflict pnVar16;
  uint *puVar17;
  node_t_conflict pnVar18;
  int extraout_EDX;
  node_t_conflict *base;
  ulong *puVar19;
  uint *puVar20;
  type *ptVar21;
  node_code_t nVar22;
  node_t pnVar23;
  node_t pnVar24;
  node_t pnVar25;
  ulong uVar26;
  c2m_ctx_t pcVar27;
  c2m_ctx_t c2m_ctx_00;
  char *in_R8;
  node_t *ppnVar28;
  code *pcVar29;
  uint uVar30;
  node_code_t nVar31;
  bool bVar32;
  pos_t pVar33;
  symbol_t el;
  node_t pnStackY_188;
  undefined4 uStack_8c;
  undefined8 uStack_78;
  undefined8 uStack_70;
  VARR_node_t *pVStack_68;
  symbol_t local_60;
  
  pnVar25 = (labels->u).ops.head;
  if (pnVar25 == (node_t)0x0) {
    return;
  }
  pcVar3 = c2m_ctx->check_ctx;
LAB_0018705f:
  if (pnVar25->code == N_LABEL) {
    pnVar16 = (pnVar25->u).ops.head;
    el_00._4_4_ = uStack_8c;
    el_00.mode = 2;
    el_00.id = pnVar16;
    el_00.scope = pcVar3->func_block_scope;
    el_00.def_node = (node_t_conflict)uStack_78;
    el_00.aux_node = (node_t_conflict)uStack_70;
    el_00.defs = pVStack_68;
    iVar9 = HTAB_symbol_t_do(c2m_ctx->symbol_tab,el_00,HTAB_FIND,&local_60);
    if (iVar9 == 0) {
      in_R8 = (char *)target;
      symbol_insert(c2m_ctx,S_LABEL,pnVar16,pcVar3->func_block_scope,target,(node_t_conflict)0x0);
      goto LAB_00187221;
    }
    pVar33 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)pnVar16->uid);
    in_R8 = (pnVar16->u).s.s;
    pcVar15 = "label %s redeclaration";
LAB_001871bc:
    error(c2m_ctx,pcVar15,pVar33.fname,pVar33._8_8_);
  }
  else {
    if (pcVar3->curr_switch == (node_t_conflict)0x0) {
      pVar33 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)pnVar25->uid)
      ;
      in_R8 = "default label";
      if (pnVar25->code == N_CASE) {
        in_R8 = "case label";
      }
      pcVar15 = "%s not within a switch-stmt";
      goto LAB_001871bc;
    }
    ptVar4 = (type *)pcVar3->curr_switch->attr;
    pcVar27 = c2m_ctx;
    if ((pnVar25->code == N_CASE) &&
       (pnVar16 = (pnVar25->u).ops.head, pnVar16 != (node_t_conflict)0x0)) {
      pnVar24 = *(node_t *)&ptVar4[1].align;
      if (pnVar24 == (node_t)0x0) {
        bVar32 = false;
      }
      else {
        bVar32 = **(int **)pnVar24 == 0x51;
      }
      pnVar18 = (pnVar16->op_link).next;
      uVar10 = check_case_expr(c2m_ctx,pnVar16,ptVar4,target);
      if (pnVar18 != (node_t_conflict)0x0) {
        iVar9 = check_case_expr(c2m_ctx,pnVar18,ptVar4,target);
        pcVar29 = error;
        uVar10 = (uint)(uVar10 != 0 && iVar9 != 0);
        if (c2m_ctx->options->pedantic_p == 0) {
          pcVar29 = warning;
        }
        pVar33 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                              (node_t_conflict)(ulong)pnVar25->uid);
        (*pcVar29)(c2m_ctx,pVar33.fname,pVar33._8_8_,"range cases are not a part of C standard");
      }
      if (uVar10 != 0) {
        pnVar23 = (node_t)0x20;
        pnVar11 = (node_t)reg_malloc(c2m_ctx,0x20);
        *(node_t *)pnVar11 = pnVar25;
        pnVar11->attr = target;
        if (!bVar32) goto LAB_001871e8;
        pnVar16 = target;
        if ((pnVar24 == (node_t)0x0) || (*(long *)&ptVar4[1].align == 0)) {
LAB_00187364:
          check_labels_cold_3();
LAB_00187369:
          check_labels_cold_1();
        }
        else {
          pnVar16 = (pnVar24->op_link).prev;
          pnVar23 = *(node_t *)&ptVar4[1].mode;
          if (pnVar16 != (node_t_conflict)0x0) {
            if (pnVar23 != (node_t)0x0) {
              (pnVar16->op_link).next = pnVar11;
              (pnVar11->op_link).prev = pnVar16;
              (pnVar24->op_link).prev = pnVar11;
              (pnVar11->op_link).next = pnVar24;
              goto LAB_00187221;
            }
            goto LAB_00187369;
          }
          if (pnVar23 == pnVar24) {
            (pnVar24->op_link).prev = pnVar11;
            (pnVar11->op_link).next = pnVar24;
            (pnVar11->op_link).prev = (node_t)0x0;
            *(node_t *)&ptVar4[1].mode = pnVar11;
            goto LAB_00187221;
          }
        }
        check_labels_cold_2();
        puVar5 = (ulong *)pcVar27->env[0].__jmpbuf[5];
        if (puVar5 == (ulong *)0x0) {
          HTAB_case_t_do_cold_8();
          pnVar18 = pnVar16;
          pnVar25 = pnVar24;
        }
        else {
          puVar6 = (undefined8 *)pcVar27->env[0].__jmpbuf[4];
          pnVar18 = pnVar16;
          pnVar25 = pnVar24;
          in_R8 = (char *)pcVar27;
          if (puVar6 != (undefined8 *)0x0) {
            pnVar11 = (node_t)pcVar27->env[0].__jmpbuf[0];
            uVar10 = (uint)*puVar5;
            uVar30 = uVar10;
            if ((extraout_EDX != 1) || (iVar9 = (int)*puVar6, *(int *)&pcVar27->options != iVar9))
            goto LAB_00187503;
            c2m_ctx_00 = (c2m_ctx_t)puVar5[2];
            pnVar25 = pnVar11;
            if (c2m_ctx_00 == (c2m_ctx_t)0x0) goto LAB_00187642;
            uVar30 = uVar10 * 2;
            uVar26 = (ulong)uVar30;
            if (puVar5[1] == uVar26) {
              *puVar5 = uVar26;
              puVar19 = puVar5;
            }
            else {
              pnVar25 = (node_t)(uVar26 * 4);
              pvVar12 = realloc(c2m_ctx_00,(size_t)pnVar25);
              puVar5[2] = (ulong)pvVar12;
              puVar19 = (ulong *)pcVar27->env[0].__jmpbuf[5];
              puVar5[1] = uVar26;
              *puVar5 = uVar26;
              if (puVar19 == (ulong *)0x0) goto LAB_00187647;
            }
            if (uVar30 != 0) {
              c2m_ctx_00 = (c2m_ctx_t)puVar19[2];
              pnVar25 = (node_t)0xff;
              memset(c2m_ctx_00,0xff,(ulong)(uVar10 & 0x7fffffff) << 3);
            }
            puVar5 = (ulong *)pcVar27->env[0].__jmpbuf[4];
            if ((puVar5 == (ulong *)0x0) ||
               (c2m_ctx_00 = (c2m_ctx_t)puVar5[2], c2m_ctx_00 == (c2m_ctx_t)0x0)) goto LAB_0018763d;
            uVar26 = (ulong)(uint)(iVar9 * 2);
            if (puVar5[1] == uVar26) {
              *puVar5 = uVar26;
              puVar19 = puVar5;
            }
            else {
              pnVar25 = (node_t)(uVar26 << 4);
              pvVar12 = realloc(c2m_ctx_00,(size_t)pnVar25);
              puVar5[2] = (ulong)pvVar12;
              puVar19 = (ulong *)pcVar27->env[0].__jmpbuf[4];
              puVar5[1] = uVar26;
              *puVar5 = uVar26;
              if (puVar19 == (ulong *)0x0) goto LAB_0018764c;
            }
            pnVar18 = (node_t_conflict)puVar19[2];
            uVar10 = *(uint *)((long)&pcVar27->ctx + 4);
            uVar2 = *(uint *)&pcVar27->options;
            *(undefined4 *)&pcVar27->ctx = 0;
            *(undefined4 *)&pcVar27->options = 0;
            *(undefined4 *)((long)&pcVar27->ctx + 4) = 0;
            if (uVar10 < uVar2) {
              iVar9 = uVar2 - uVar10;
              ppnVar28 = (node_t *)(&pnVar18->attr + (ulong)uVar10 * 2);
              do {
                if (((node *)(ppnVar28 + -1))->code != N_IGNORE) {
                  pnVar18 = pnVar16;
                  HTAB_case_t_do((HTAB_case_t *)pcVar27,(case_t_conflict)*ppnVar28,HTAB_INSERT,
                                 (case_t_conflict *)pnVar16);
                  (*(code *)pcVar27->env[0].__jmpbuf[2])
                            (*(case_t_conflict *)pnVar16,*ppnVar28,pnVar11);
                }
                ppnVar28 = ppnVar28 + 2;
                iVar9 = iVar9 + -1;
              } while (iVar9 != 0);
            }
LAB_00187503:
            iVar9 = (*(code *)pcVar27->env[0].__jmpbuf[1])(pnVar24,pnVar11);
            nVar22 = iVar9 + (uint)(iVar9 == 0);
            pnVar25 = (node_t)(ulong)nVar22;
            lVar14 = pcVar27->env[0].__jmpbuf[5];
            if (lVar14 == 0) {
LAB_00187633:
              HTAB_case_t_do_cold_4();
              c2m_ctx_00 = pcVar27;
            }
            else {
              pnVar18 = (node_t_conflict)pcVar27->env[0].__jmpbuf[4];
              c2m_ctx_00 = pcVar27;
              if (pnVar18 != (node_t_conflict)0x0) {
                lVar14 = *(long *)(lVar14 + 0x10);
                pnVar23 = (pnVar18->op_link).prev;
                puVar20 = (uint *)0x0;
                nVar31 = nVar22;
                do {
                  nVar31 = nVar31 & uVar30 - N_I;
                  puVar17 = (uint *)(lVar14 + (ulong)nVar31 * 4);
                  uVar26 = (ulong)*puVar17;
                  if (uVar26 != 0xfffffffe) {
                    if (*puVar17 == 0xffffffff) {
                      if (extraout_EDX != 1) {
                        return;
                      }
                      *(int *)&pcVar27->ctx = *(int *)&pcVar27->ctx + 1;
                      uVar10 = *(uint *)&pcVar27->options;
                      if (puVar20 != (uint *)0x0) {
                        puVar17 = puVar20;
                      }
                      (&pnVar23->code)[(ulong)uVar10 * 4] = nVar22;
                      (&pnVar23->attr)[(ulong)uVar10 * 2] = pnVar24;
                      *(uint *)&pcVar27->options = uVar10 + 1;
                      *puVar17 = uVar10;
                      goto LAB_00187612;
                    }
                    puVar17 = puVar20;
                    if (((&pnVar23->code)[uVar26 * 4] == nVar22) &&
                       (iVar9 = (*(code *)pcVar27->env[0].__jmpbuf[2])
                                          ((&pnVar23->attr)[uVar26 * 2],pnVar24,pnVar11), iVar9 != 0
                       )) {
                      pnVar24 = (node_t)(&pnVar23->attr)[uVar26 * 2];
LAB_00187612:
                      *(node_t *)pnVar16 = pnVar24;
                      return;
                    }
                  }
                  piVar8 = (int *)((long)&pcVar27->options + 4);
                  *piVar8 = *piVar8 + 1;
                  pnVar25 = (node_t)((ulong)pnVar25 >> 0xb);
                  nVar31 = (int)pnVar25 + 1 + nVar31 * 5;
                  puVar20 = puVar17;
                } while( true );
              }
            }
            pcVar27 = (c2m_ctx_t)in_R8;
            HTAB_case_t_do_cold_3();
LAB_0018763d:
            HTAB_case_t_do_cold_5();
LAB_00187642:
            HTAB_case_t_do_cold_6();
LAB_00187647:
            HTAB_case_t_do_cold_1();
LAB_0018764c:
            HTAB_case_t_do_cold_2();
            do {
              pnVar16 = (node_t_conflict)pnVar25->attr;
              if ((pnVar16->code & N_I) != N_IGNORE) {
                pnVar11 = (pnVar16->op_link).next;
                iVar9 = *(int *)&(pnVar11->op_link).next;
                if (iVar9 == 1) {
                  if (0xfffffff3 < pnVar11[1].code - N_STR16) goto LAB_001879c8;
                }
                else if (iVar9 == 2) {
LAB_001879c8:
                  *base = (node_t_conflict)0x0;
                  uVar10 = pnVar16[1].uid;
                  pnVar18->code = pnVar16[1].code;
                  pnVar18->uid = uVar10;
                  goto LAB_001879dc;
                }
              }
              iVar9 = pnVar25->code;
              if (iVar9 != 0x3f) {
                if (iVar9 < 0x28) {
                  if (iVar9 - 0xdU < 3) {
                    *base = pnVar25;
                    *(case_t_conflict *)pnVar18 = (case_t_conflict)0x0;
                    *(node_code_t *)&pcVar27->ctx = N_IGNORE;
                    return;
                  }
                  if (iVar9 != 0x10) {
                    return;
                  }
                  pnVar25 = (pnVar16->op_link).prev;
                  if (pnVar25 == (node_t)0x0) {
                    return;
                  }
                  if ((pnVar25->code == N_FUNC_DEF) ||
                     ((pnVar25->code == N_SPEC_DECL &&
                      (*(int *)(*(long *)((long)pnVar25->attr + 0x40) + 0x18) == 7)))) {
                    *base = pnVar25;
                    nVar22 = N_IGNORE;
                  }
                  else {
                    if (pnVar16->attr == (void *)0x0) {
                      return;
                    }
                    lVar14 = *(long *)((long)pnVar16->attr + 8);
                    if ((*(node_t_conflict *)(lVar14 + 0x18) != c2m_ctx_00->top_scope) &&
                       (*(int *)(lVar14 + 0x38) != 0)) {
                      return;
                    }
                    *base = pnVar25;
                    nVar22 = (node_code_t)(((pnVar16->op_link).next)->attr == (void *)0x0);
                  }
                  *(node_code_t *)&pcVar27->ctx = nVar22;
                  *(case_t_conflict *)pnVar18 = (case_t_conflict)0x0;
                  return;
                }
                switch(iVar9) {
                case 0x28:
                case 0x2a:
                  pnVar11 = (pnVar25->u).ops.head;
                  if (pnVar11 == (node_t)0x0) {
                    return;
                  }
                  pnStackY_188 = (pnVar11->op_link).next;
                  if (pnStackY_188 == (node_t)0x0) {
                    return;
                  }
                  pnVar23 = pnVar11;
                  if ((iVar9 == 0x28) && ((*pnVar11->attr & 1) != 0)) {
                    pnVar23 = pnStackY_188;
                    pnStackY_188 = pnVar11;
                  }
                  iVar9 = check_const_addr_p(c2m_ctx_00,pnVar23,base,(mir_llong *)pnVar18,
                                             (int *)pcVar27);
                  if (iVar9 == 0) {
                    return;
                  }
                  if ((*(node_code_t *)&pcVar27->ctx != N_IGNORE) &&
                     (*(long *)(*(long *)((long)pnVar23->attr + 0x18) + 8) == 0)) {
                    return;
                  }
                  pbVar7 = (byte *)pnStackY_188->attr;
                  if ((*pbVar7 & 1) == 0) {
                    if ((*pbVar7 & 2) == 0) {
                      return;
                    }
                    if (*(int **)(pbVar7 + 0x10) == (int *)0x0) {
                      return;
                    }
                    if (**(int **)(pbVar7 + 0x10) != 0x53) {
                      return;
                    }
                  }
                  pnVar11 = (((node_t_conflict)pnVar25->attr)->op_link).next;
                  uVar10 = *(uint *)&(pnVar11->op_link).next;
                  mVar13 = (mir_size_t)uVar10;
                  if (mVar13 != 1) {
                    if (uVar10 != 3) {
                      __assert_fail("type->mode == TM_BASIC || type->mode == TM_PTR",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                                    ,0x1d85,
                                    "int check_const_addr_p(c2m_ctx_t, node_t, node_t *, mir_llong *, int *)"
                                   );
                    }
                    ptVar4 = *(type **)(pnVar11 + 1);
                    mVar13 = 1;
                    if (ptVar4->mode != TM_FUNC) {
                      ptVar21 = ptVar4->arr_type;
                      if (ptVar4->arr_type == (type *)0x0) {
                        ptVar21 = ptVar4;
                      }
                      mVar13 = raw_type_size(c2m_ctx_00,ptVar21);
                      uVar26 = (ulong)ptVar21->align;
                      if (uVar26 != 0) {
                        uVar1 = (mVar13 - 1) + uVar26;
                        mVar13 = uVar1 - uVar1 % uVar26;
                      }
                    }
                  }
                  lVar14 = -(mVar13 * *(long *)(pbVar7 + 0x30));
                  if (pnVar25->code == 0x28) {
                    lVar14 = mVar13 * *(long *)(pbVar7 + 0x30);
                  }
                  *(case_t_conflict *)pnVar18 =
                       (case_t_conflict)((long)&(*(case_t_conflict *)pnVar18)->case_node + lVar14);
                  return;
                case 0x29:
                case 0x2b:
                case 0x2c:
                case 0x2d:
                case 0x2e:
                case 0x2f:
                case 0x30:
                case 0x31:
                  return;
                case 0x32:
                  pnVar16 = (pnVar25->u).ops.head;
                  if (*(int *)(*(long *)((long)pnVar16->attr + 0x18) + 0x18) != 3) {
                    return;
                  }
                  iVar9 = check_const_addr_p(c2m_ctx_00,pnVar16,base,(mir_llong *)pnVar18,
                                             (int *)pcVar27);
                  if (iVar9 == 0) {
                    return;
                  }
                  pbVar7 = (byte *)((((pnVar25->u).ops.head)->op_link).next)->attr;
                  if ((*pbVar7 & 1) == 0) {
                    return;
                  }
                  ptVar4 = (type *)(((node_t_conflict)pnVar25->attr)->op_link).next;
                  ptVar21 = ptVar4->arr_type;
                  if (ptVar21 == (type *)0x0) {
                    ptVar21 = ptVar4;
                  }
                  mVar13 = raw_type_size(c2m_ctx_00,ptVar21);
                  uVar26 = (ulong)ptVar21->align;
                  if (uVar26 != 0) {
                    uVar1 = (mVar13 - 1) + uVar26;
                    mVar13 = uVar1 - uVar1 % uVar26;
                  }
                  *(node_code_t *)&pcVar27->ctx = N_I;
                  *(case_t_conflict *)pnVar18 =
                       (case_t_conflict)
                       ((long)&(*(case_t_conflict *)pnVar18)->case_node +
                       mVar13 * *(long *)(pbVar7 + 0x30));
                  return;
                case 0x33:
                case 0x36:
                  iVar9 = check_const_addr_p(c2m_ctx_00,(pnVar25->u).ops.head,base,
                                             (mir_llong *)pnVar18,(int *)pcVar27);
                  if (iVar9 == 0) {
                    return;
                  }
                  if (*(node_code_t *)&pcVar27->ctx != (uint)(pnVar25->code == 0x33)) {
                    return;
                  }
                  *(node_code_t *)&pcVar27->ctx = N_I;
                  pvVar12 = ((node_t_conflict)pnVar25->attr)->attr;
                  if (pvVar12 == (void *)0x0) {
                    return;
                  }
                  *(case_t_conflict *)pnVar18 =
                       (case_t_conflict)
                       ((long)&(*(case_t_conflict *)pnVar18)->case_node +
                       *(long *)(*(long *)((long)pvVar12 + 8) + 0x10));
                  return;
                case 0x34:
                case 0x35:
                  pnVar16 = (pnVar25->u).ops.head;
                  pvVar12 = pnVar16->attr;
                  iVar9 = check_const_addr_p(c2m_ctx_00,pnVar16,base,(mir_llong *)pnVar18,
                                             (int *)pcVar27);
                  if (iVar9 == 0) {
                    return;
                  }
                  if (pnVar25->code == 0x34) {
                    lVar14 = *(long *)((long)pvVar12 + 0x18);
                    iVar9 = *(int *)(lVar14 + 0x18);
                    if ((iVar9 == 6) || ((iVar9 == 3 && (*(long *)(lVar14 + 8) != 0)))) {
                      if ((int)*(node_code_t *)&pcVar27->ctx < 1) {
                        return;
                      }
                      *(node_code_t *)&pcVar27->ctx = *(node_code_t *)&pcVar27->ctx - N_I;
                      return;
                    }
                  }
                  if (pnVar16->code == N_ID) {
                    piVar8 = *(int **)((long)pvVar12 + 0x10);
                    iVar9 = *piVar8;
                    if (iVar9 == 0x7d) {
                      return;
                    }
                    if ((iVar9 == 0x55) &&
                       (*(int *)(*(long *)(*(long *)(piVar8 + 2) + 0x40) + 0x18) == 7)) {
                      return;
                    }
                  }
                  if (pnVar25->code == 0x35) {
                    nVar22 = *(node_code_t *)&pcVar27->ctx + N_I;
                  }
                  else {
                    nVar22 = *(node_code_t *)&pcVar27->ctx - N_I;
                  }
                  *(node_code_t *)&pcVar27->ctx = nVar22;
                  return;
                default:
                  if (iVar9 != 0x53) {
                    return;
                  }
                  *base = pnVar25;
                  *(case_t_conflict *)pnVar18 = (case_t_conflict)0x0;
                }
LAB_001879dc:
                *(node_code_t *)&pcVar27->ctx = N_IGNORE;
                return;
              }
              ptVar4 = *(type **)((long)((pnVar25->u).ops.head)->attr + 0x18);
              mVar13 = raw_type_size(c2m_ctx_00,ptVar4);
              uVar26 = (ulong)ptVar4->align;
              if (uVar26 != 0) {
                uVar1 = (mVar13 - 1) + uVar26;
                mVar13 = uVar1 - uVar1 % uVar26;
              }
              if (mVar13 != 8) {
                return;
              }
              pnVar11 = (pnVar25->u).ops.head;
              pnVar25 = (node_t)0x0;
              if (pnVar11 != (node_t)0x0) {
                pnVar25 = (pnVar11->op_link).next;
              }
            } while( true );
          }
        }
        HTAB_case_t_do_cold_7();
        goto LAB_00187633;
      }
    }
    else if ((*(undefined8 **)&ptVar4[1].align == (undefined8 *)0x0) ||
            (*(int *)**(undefined8 **)&ptVar4[1].align != 0x51)) {
      pnVar23 = (node_t)0x20;
      pnVar11 = (node_t)reg_malloc(c2m_ctx,0x20);
      *(node_t *)pnVar11 = pnVar25;
      pnVar11->attr = target;
LAB_001871e8:
      ppnVar28 = (node_t *)&ptVar4[1].mode;
      pnVar16 = *(node_t_conflict *)&ptVar4[1].align;
      if (pnVar16 == (node_t)0x0) {
        lVar14._0_4_ = ptVar4[1].mode;
        lVar14._4_1_ = ptVar4[1].func_type_before_adjustment_p;
        lVar14._5_1_ = ptVar4[1].unnamed_anon_struct_union_member_type_p;
        lVar14._6_2_ = *(undefined2 *)&ptVar4[1].field_0x1e;
        pnVar24 = pnVar23;
        if (lVar14 != 0) goto LAB_0018735f;
      }
      else {
        if ((pnVar16->op_link).next != (node_t)0x0) {
          check_labels_cold_4();
          pnVar24 = pnVar23;
LAB_0018735f:
          check_labels_cold_5();
          goto LAB_00187364;
        }
        ppnVar28 = &(pnVar16->op_link).next;
      }
      *ppnVar28 = pnVar11;
      (pnVar11->op_link).next = (node_t)0x0;
      (pnVar11->op_link).prev = pnVar16;
      *(node_t *)&ptVar4[1].align = pnVar11;
    }
    else {
      pVar33 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)pnVar25->uid)
      ;
      error(c2m_ctx,0x1c08bc,pVar33.fname,pVar33._8_8_);
    }
  }
LAB_00187221:
  pnVar25 = (pnVar25->op_link).next;
  if (pnVar25 == (node_t)0x0) {
    return;
  }
  goto LAB_0018705f;
}

Assistant:

static void check_labels (c2m_ctx_t c2m_ctx, node_t labels, node_t target) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;

  for (node_t l = NL_HEAD (labels->u.ops); l != NULL; l = NL_NEXT (l)) {
    if (l->code == N_LABEL) {
      symbol_t sym;
      node_t id = NL_HEAD (l->u.ops);

      if (symbol_find (c2m_ctx, S_LABEL, id, func_block_scope, &sym)) {
        error (c2m_ctx, POS (id), "label %s redeclaration", id->u.s.s);
      } else {
        symbol_insert (c2m_ctx, S_LABEL, id, func_block_scope, target, NULL);
      }
    } else if (curr_switch == NULL) {
      error (c2m_ctx, POS (l), "%s not within a switch-stmt",
             l->code == N_CASE ? "case label" : "default label");
    } else {
      struct switch_attr *switch_attr = curr_switch->attr;
      struct type *type = &switch_attr->type;
      node_t case_expr = l->code == N_CASE ? NL_HEAD (l->u.ops) : NULL;
      node_t case_expr2 = l->code == N_CASE ? NL_EL (l->u.ops, 1) : NULL;
      case_t case_attr, tail = DLIST_TAIL (case_t, switch_attr->case_labels);
      int ok_p = FALSE, default_p = tail != NULL && tail->case_node->code == N_DEFAULT;

      if (case_expr == NULL) {
        if (default_p) {
          error (c2m_ctx, POS (l), "multiple default labels in one switch");
        } else {
          ok_p = TRUE;
        }
      } else {
        ok_p = check_case_expr (c2m_ctx, case_expr, type, target);
        if (case_expr2 != NULL) {
          ok_p = check_case_expr (c2m_ctx, case_expr2, type, target) && ok_p;
          (c2m_options->pedantic_p ? error : warning) (c2m_ctx, POS (l),
                                                       "range cases are not a part of C standard");
        }
      }
      if (ok_p) {
        case_attr = reg_malloc (c2m_ctx, sizeof (struct case_attr));
        case_attr->case_node = l;
        case_attr->case_target_node = target;
        if (default_p) {
          DLIST_INSERT_BEFORE (case_t, switch_attr->case_labels, tail, case_attr);
        } else {
          DLIST_APPEND (case_t, switch_attr->case_labels, case_attr);
        }
      }
    }
  }
}